

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLPrinter::XMLPrinter(XMLPrinter *this,FILE *file,bool compact,int depth)

{
  DynArray<char,_20> *pDVar1;
  undefined4 in_ECX;
  byte in_DL;
  _func_int **in_RSI;
  DynArray<char,_20> *in_RDI;
  char entityValue;
  int i_1;
  int i;
  int local_2c;
  int local_28;
  
  XMLVisitor::XMLVisitor((XMLVisitor *)in_RDI);
  in_RDI->_mem = (char *)&PTR__XMLPrinter_00399080;
  in_RDI->_pool[0] = '\0';
  DynArray<const_char_*,_10>::DynArray((DynArray<const_char_*,_10> *)(in_RDI->_pool + 8));
  *(undefined1 *)&in_RDI[2]._size = 1;
  in_RDI[3]._mem = (char *)in_RSI;
  *(undefined4 *)in_RDI[3]._pool = in_ECX;
  in_RDI[3]._pool[4] = -1;
  in_RDI[3]._pool[5] = -1;
  in_RDI[3]._pool[6] = -1;
  in_RDI[3]._pool[7] = -1;
  in_RDI[3]._pool[8] = '\x01';
  in_RDI[3]._pool[9] = in_DL & 1;
  pDVar1 = in_RDI + 6;
  DynArray<char,_20>::DynArray((DynArray<char,_20> *)&pDVar1->_size);
  for (local_28 = 0; local_28 < 0x40; local_28 = local_28 + 1) {
    in_RDI[3]._pool[(long)local_28 + 10] = '\0';
    in_RDI[5]._pool[(long)local_28 + -6] = '\0';
  }
  for (local_2c = 0; local_2c < 5; local_2c = local_2c + 1) {
    in_RDI[3]._pool[(ulong)(byte)entities[(long)local_2c * 0x10 + 0xc] + 10] = '\x01';
  }
  *(undefined1 *)&in_RDI[6]._mem = 1;
  in_RDI[6]._pool[0xe] = '\x01';
  in_RDI[6]._pool[0x10] = '\x01';
  DynArray<char,_20>::Push(in_RDI,(char)((ulong)&pDVar1->_size >> 0x38));
  return;
}

Assistant:

XMLPrinter::XMLPrinter( FILE* file, bool compact, int depth ) :
    _elementJustOpened( false ),
    _firstElement( true ),
    _fp( file ),
    _depth( depth ),
    _textDepth( -1 ),
    _processEntities( true ),
    _compactMode( compact )
{
    for( int i=0; i<ENTITY_RANGE; ++i ) {
        _entityFlag[i] = false;
        _restrictedEntityFlag[i] = false;
    }
    for( int i=0; i<NUM_ENTITIES; ++i ) {
        const char entityValue = entities[i].value;
        TIXMLASSERT( 0 <= entityValue && entityValue < ENTITY_RANGE );
        _entityFlag[ (unsigned char)entityValue ] = true;
    }
    _restrictedEntityFlag[(unsigned char)'&'] = true;
    _restrictedEntityFlag[(unsigned char)'<'] = true;
    _restrictedEntityFlag[(unsigned char)'>'] = true;	// not required, but consistency is nice
    _buffer.Push( 0 );
}